

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall
dxil_spv::CFGNode::
traverse_dominated_blocks<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3>
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header,
          anon_class_72_9_20eaa7ce *op)

{
  CFGNode **ppCVar1;
  CFGNode *pCVar2;
  CFGNode *to;
  CFGStructurizer *this_00;
  CFGNode **ppCVar3;
  CFGNode *from;
  bool bVar4;
  size_type sVar5;
  ulong uVar6;
  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var7;
  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var8;
  pointer ppCVar9;
  long lVar10;
  CFGNode *node;
  CFGNode *local_60;
  ulong local_58;
  CFGNode *local_50;
  CFGNode **local_48;
  CFGNode **local_40;
  pointer local_38;
  
  ppCVar9 = (this->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->succ).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = header;
  do {
    if (ppCVar9 == local_38) {
      return;
    }
    local_60 = *ppCVar9;
    sVar5 = std::
            _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&completed->_M_h,&local_60);
    if (sVar5 == 0) {
      std::__detail::
      _Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)completed,&local_60);
      bVar4 = dominates(local_50,local_60);
      from = local_60;
      if (bVar4) {
        ppCVar1 = op->merge;
        pCVar2 = *ppCVar1;
        if ((pCVar2 != local_60) && (to = *op->potential_inner_merge_target, to != local_60)) {
          this_00 = op->this;
          bVar4 = CFGStructurizer::query_reachability(this_00,local_60,pCVar2);
          if ((bVar4) && (bVar4 = CFGStructurizer::query_reachability(this_00,from,to), bVar4)) {
            _Var7._M_current =
                 (from->succ).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ppCVar3 = (from->succ).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar6 = (long)ppCVar3 - (long)_Var7._M_current;
            if (8 < uVar6) {
              local_48 = ppCVar1;
              for (lVar10 = (long)uVar6 >> 5; 0 < lVar10; lVar10 = lVar10 + -1) {
                local_58 = uVar6;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                      *)&local_48,_Var7);
                _Var8._M_current = _Var7._M_current;
                if (bVar4) goto LAB_00138dcd;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                      *)&local_48,
                                     (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )(_Var7._M_current + 1));
                _Var8._M_current = _Var7._M_current + 1;
                if (bVar4) goto LAB_00138dcd;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                      *)&local_48,
                                     (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )(_Var7._M_current + 2));
                _Var8._M_current = _Var7._M_current + 2;
                if (bVar4) goto LAB_00138dcd;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                      *)&local_48,
                                     (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )(_Var7._M_current + 3));
                _Var8._M_current = _Var7._M_current + 3;
                if (bVar4) goto LAB_00138dcd;
                _Var7._M_current = _Var7._M_current + 4;
                uVar6 = local_58 - 0x20;
              }
              lVar10 = (long)uVar6 >> 3;
              if (lVar10 == 1) {
LAB_00138db6:
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                      *)&local_48,_Var7);
                _Var8._M_current = ppCVar3;
                if (bVar4) {
                  _Var8._M_current = _Var7._M_current;
                }
              }
              else if (lVar10 == 2) {
LAB_00138d91:
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                      *)&local_48,_Var7);
                _Var8._M_current = _Var7._M_current;
                if (!bVar4) {
                  _Var7._M_current = _Var7._M_current + 1;
                  goto LAB_00138db6;
                }
              }
              else {
                _Var8._M_current = ppCVar3;
                if ((lVar10 == 3) &&
                   (bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#1}>
                            ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_1_>
                                          *)&local_48,_Var7), _Var8._M_current = _Var7._M_current,
                   !bVar4)) {
                  _Var7._M_current = _Var7._M_current + 1;
                  goto LAB_00138d91;
                }
              }
LAB_00138dcd:
              _Var7._M_current =
                   (from->succ).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              ppCVar1 = (from->succ).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_48 = op->potential_inner_merge_target;
              uVar6 = (long)ppCVar1 - (long)_Var7._M_current;
              local_40 = _Var8._M_current;
              for (lVar10 = (long)uVar6 >> 5; 0 < lVar10; lVar10 = lVar10 + -1) {
                local_58 = uVar6;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                      *)&local_48,_Var7);
                _Var8._M_current = _Var7._M_current;
                if (bVar4) goto LAB_00138ee4;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                      *)&local_48,
                                     (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )(_Var7._M_current + 1));
                _Var8._M_current = _Var7._M_current + 1;
                if (bVar4) goto LAB_00138ee4;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                      *)&local_48,
                                     (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )(_Var7._M_current + 2));
                _Var8._M_current = _Var7._M_current + 2;
                if (bVar4) goto LAB_00138ee4;
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                      *)&local_48,
                                     (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )(_Var7._M_current + 3));
                _Var8._M_current = _Var7._M_current + 3;
                if (bVar4) goto LAB_00138ee4;
                _Var7._M_current = _Var7._M_current + 4;
                uVar6 = local_58 - 0x20;
              }
              lVar10 = (long)uVar6 >> 3;
              if (lVar10 == 1) {
LAB_00138fd6:
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                      *)&local_48,_Var7);
                _Var8._M_current = _Var7._M_current;
                if (!bVar4) {
                  _Var8._M_current = ppCVar1;
                }
              }
              else if (lVar10 == 2) {
LAB_00138ebb:
                bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                        ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                      *)&local_48,_Var7);
                _Var8._M_current = _Var7._M_current;
                if (!bVar4) {
                  _Var7._M_current = _Var7._M_current + 1;
                  goto LAB_00138fd6;
                }
              }
              else {
                _Var8._M_current = ppCVar1;
                if ((lVar10 == 3) &&
                   (bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::$_3::operator()(dxil_spv::CFGNode_const*)const::{lambda(dxil_spv::CFGNode_const*)#2}>
                            ::operator()((_Iter_pred<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3::operator()(dxil_spv::CFGNode_const*)const::_lambda(dxil_spv::CFGNode_const*)_2_>
                                          *)&local_48,_Var7), _Var8._M_current = _Var7._M_current,
                   !bVar4)) {
                  _Var7._M_current = _Var7._M_current + 1;
                  goto LAB_00138ebb;
                }
              }
LAB_00138ee4:
              ppCVar3 = (from->succ).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((_Var8._M_current == ppCVar3) && (local_40 != ppCVar1)) {
                pCVar2 = *op->first_natural_breaks_to_outer;
                if ((pCVar2 == (CFGNode *)0x0) ||
                   (pCVar2->forward_post_visit_order < from->forward_post_visit_order)) {
                  *op->first_natural_breaks_to_outer = from;
                }
                pCVar2 = *op->last_natural_breaks_to_outer;
                if ((pCVar2 == (CFGNode *)0x0) ||
                   (from->forward_post_visit_order < pCVar2->forward_post_visit_order)) {
                  *op->last_natural_breaks_to_outer = from;
                }
              }
              if (_Var8._M_current != ppCVar3) {
                pCVar2 = *op->first_natural_breaks_to_inner;
                if ((pCVar2 == (CFGNode *)0x0) ||
                   (pCVar2->forward_post_visit_order < from->forward_post_visit_order)) {
                  *op->first_natural_breaks_to_inner = from;
                }
                pCVar2 = *op->last_natural_breaks_to_inner;
                if ((pCVar2 == (CFGNode *)0x0) ||
                   (from->forward_post_visit_order < pCVar2->forward_post_visit_order)) {
                  *op->last_natural_breaks_to_inner = from;
                }
              }
            }
            traverse_dominated_blocks<dxil_spv::CFGStructurizer::header_and_merge_block_have_entry_exit_relationship(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__3>
                      (local_60,completed,local_50,op);
          }
        }
      }
    }
    ppCVar9 = ppCVar9 + 1;
  } while( true );
}

Assistant:

void CFGNode::traverse_dominated_blocks(UnorderedSet<const CFGNode *> &completed,
                                        const CFGNode &header, const Op &op) const
{
	for (auto *node : succ)
	{
		bool can_visit = completed.count(node) == 0;
		if (can_visit)
			completed.insert(node);

		if (can_visit && header.dominates(node))
		{
			if (op(node))
				node->traverse_dominated_blocks(completed, header, op);
		}
	}
}